

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::deleteContents
          (PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *this)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  value_type pEVar4;
  ulong uVar5;
  long lVar6;
  size_type sVar7;
  reference ppEVar8;
  long *in_RDI;
  size_t i_1;
  uint32_t i;
  PtexCachedReader *in_stack_ffffffffffffff78;
  value_type in_stack_ffffffffffffff80;
  undefined1 local_30 [24];
  ulong local_18;
  uint local_c;
  
  for (local_c = 0; local_c < *(uint *)(in_RDI + 1); local_c = local_c + 1) {
    if ((*(long *)(*in_RDI + (ulong)local_c * 0x20 + 0x18) != 0) &&
       (plVar1 = *(long **)(*in_RDI + (ulong)local_c * 0x20 + 0x18), plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  lVar2 = *in_RDI;
  if (lVar2 != 0) {
    lVar3 = *(long *)(lVar2 + -8);
    for (lVar6 = lVar2 + lVar3 * 0x20; lVar2 != lVar6; lVar6 = lVar6 + -0x20) {
      Entry::~Entry((Entry *)0xaa7e45);
    }
    operator_delete__((void *)(lVar2 + -8),lVar3 * 0x20 + 8);
  }
  for (local_18 = 0; uVar5 = local_18,
      sVar7 = std::
              vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
              ::size((vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
                      *)(in_RDI + 2)), uVar5 < sVar7; local_18 = local_18 + 1) {
    ppEVar8 = std::
              vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
              ::operator[]((vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
                            *)(in_RDI + 2),local_18);
    pEVar4 = *ppEVar8;
    if (pEVar4 != (value_type)0x0) {
      in_stack_ffffffffffffff78 = pEVar4[-1].value;
      for (in_stack_ffffffffffffff80 = pEVar4 + (long)in_stack_ffffffffffffff78;
          pEVar4 != in_stack_ffffffffffffff80;
          in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + -1) {
        Entry::~Entry((Entry *)0xaa7f0c);
      }
      operator_delete__(&pEVar4[-1].value,(long)in_stack_ffffffffffffff78 * 0x20 + 8);
    }
  }
  memset(local_30,0,0x18);
  std::
  vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ::vector((vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
            *)0xaa7f6c);
  std::
  vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ::swap((vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
          *)in_stack_ffffffffffffff80,
         (vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
          *)in_stack_ffffffffffffff78);
  std::
  vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ::~vector((vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
             *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void deleteContents()
    {
        for (uint32_t i = 0; i < _numEntries; ++i) {
            if (_entries[i].value) delete _entries[i].value;
        }
        delete [] _entries;
        for (size_t i = 0; i < _oldEntries.size(); ++i) {
            delete [] _oldEntries[i];
        }
        std::vector<Entry*>().swap(_oldEntries);
    }